

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

int my_memcasecmp(char *a,char *b,size_t len)

{
  byte bVar1;
  size_t sVar2;
  byte bVar3;
  byte bVar4;
  
  sVar2 = 0;
  while( true ) {
    if (len == sVar2) {
      return 0;
    }
    bVar1 = a[sVar2];
    bVar3 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar3 = bVar1;
    }
    bVar1 = b[sVar2];
    bVar4 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar4 = bVar1;
    }
    if (bVar3 != bVar4) break;
    sVar2 = sVar2 + 1;
  }
  return (uint)bVar3 - (uint)bVar4;
}

Assistant:

static inline int my_memcasecmp(const char* a, const char* b, size_t len) {
	while (len != 0) {
		unsigned char ua = my_tolower(*a);
		unsigned char ub = my_tolower(*b);

		if (ua != ub)
			return ua - ub;

		a++;
		b++;
		len--;
	}

	return 0;
}